

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_scriptpubkey_get_type(uchar *bytes,size_t bytes_len,size_t *written)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char cVar5;
  undefined8 unaff_RBP;
  undefined8 uVar6;
  size_t bytes_len_00;
  ulong uVar7;
  uchar *bytes_00;
  size_t n_push;
  size_t n_op;
  size_t local_48;
  size_t local_40;
  undefined8 local_38;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((bytes_len == 0 || bytes == (uchar *)0x0) || written == (size_t *)0x0) {
    return -2;
  }
  uVar1 = *bytes;
  uVar6 = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar1);
  if (uVar1 == 'j') {
    iVar3 = get_push_size(bytes + 1,bytes_len - 1,true,&local_40);
    if (((iVar3 == 0) &&
        (iVar3 = get_push_size(bytes + 1,bytes_len - 1,false,&local_48), iVar3 == 0)) &&
       (sVar4 = 1, local_40 + local_48 + 1 == bytes_len)) goto LAB_001049a2;
  }
  local_38 = uVar6;
  if ((((byte)(uVar1 + 0xaf) < 0x10 && 0x24 < bytes_len) && (bytes[bytes_len - 1] == 0xae)) &&
     ((byte)(bytes[bytes_len - 2] + 0xaf) < 0x10)) {
    uVar7 = (ulong)(bytes[bytes_len - 2] - 0x50);
    bytes_len_00 = bytes_len - 1;
    if (uVar7 != 0) {
      bytes_00 = bytes + 1;
      do {
        iVar3 = get_push_size(bytes_00,bytes_len_00,true,&local_40);
        bVar2 = false;
        if ((iVar3 == 0) &&
           (iVar3 = get_push_size(bytes_00,bytes_len_00,false,&local_48), iVar3 == 0)) {
          if ((local_48 == 0x41) || (local_48 == 0x21)) {
            if (bytes_len_00 < local_40 + local_48 + 2) {
              bVar2 = false;
            }
            else {
              bytes_00 = bytes_00 + local_40 + local_48;
              bytes_len_00 = bytes_len_00 - (local_40 + local_48);
              bVar2 = true;
            }
          }
          else {
            bVar2 = false;
          }
        }
        if (!bVar2) goto LAB_00104922;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    sVar4 = 0x20;
    if (bytes_len_00 == 2) goto LAB_001049a2;
  }
LAB_00104922:
  cVar5 = (char)local_38;
  if ((long)bytes_len < 0x19) {
    if (bytes_len == 0x16) {
      if (cVar5 != '\0') {
        return 0;
      }
      sVar4 = 8;
      if (bytes[1] != '\x14') {
        return 0;
      }
    }
    else {
      if (bytes_len != 0x17) {
        return 0;
      }
      if (cVar5 != -0x57) {
        return 0;
      }
      if (bytes[1] != '\x14') {
        return 0;
      }
      sVar4 = 4;
      if (bytes[0x16] != 0x87) {
        return 0;
      }
    }
  }
  else if (bytes_len == 0x22) {
    if (cVar5 != '\0') {
      return 0;
    }
    sVar4 = 0x10;
    if (bytes[1] != ' ') {
      return 0;
    }
  }
  else {
    if (bytes_len != 0x19) {
      return 0;
    }
    if (cVar5 != 'v') {
      return 0;
    }
    if (bytes[1] != 0xa9) {
      return 0;
    }
    if (bytes[2] != '\x14') {
      return 0;
    }
    if (bytes[0x17] != 0x88) {
      return 0;
    }
    sVar4 = 2;
    if (bytes[0x18] != 0xac) {
      return 0;
    }
  }
LAB_001049a2:
  *written = sVar4;
  return 0;
}

Assistant:

int wally_scriptpubkey_get_type(const unsigned char *bytes, size_t bytes_len,
                                size_t *written)
{
    if (written)
        *written = WALLY_SCRIPT_TYPE_UNKNOWN;

    if (!bytes || !bytes_len || !written)
        return WALLY_EINVAL;

    if (scriptpubkey_is_op_return(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_OP_RETURN;
        return WALLY_OK;
    }

    if (scriptpubkey_is_multisig(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_MULTISIG;
        return WALLY_OK;
    }

    switch (bytes_len) {
    case WALLY_SCRIPTPUBKEY_P2PKH_LEN:
        if (scriptpubkey_is_p2pkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2PKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2SH_LEN:
        if (scriptpubkey_is_p2sh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2SH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WPKH_LEN:
        if (scriptpubkey_is_p2wpkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WPKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WSH_LEN:
        if (scriptpubkey_is_p2wsh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WSH;
            return WALLY_OK;
        }
        break;
    }
    return WALLY_OK;
}